

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

double __thiscall FixedSizeCache<double>::max(FixedSizeCache<double> *this)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  runtime_error *this_00;
  double *pdVar4;
  double *pdVar5;
  
  iVar1 = this->_count;
  if ((long)iVar1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"FixedSizeCache::max() called on empty cache");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pdVar5 = (this->_data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (iVar1 != 1) {
    lVar3 = (long)iVar1 * 8 + -8;
    pdVar4 = pdVar5;
    do {
      pdVar4 = pdVar4 + 1;
      pdVar2 = pdVar4;
      if (*pdVar4 < *pdVar5 || *pdVar4 == *pdVar5) {
        pdVar2 = pdVar5;
      }
      pdVar5 = pdVar2;
      lVar3 = lVar3 + -8;
    } while (lVar3 != 0);
  }
  return *pdVar5;
}

Assistant:

bool
    empty() const
    {
        return (this->_count == 0);
    }